

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tzgnames.cpp
# Opt level: O1

UnicodeString * __thiscall
icu_63::TZGNCore::getPartialLocationName
          (TZGNCore *this,UnicodeString *tzCanonicalID,UnicodeString *mzID,UBool isLong,
          UnicodeString *mzDisplayName,UnicodeString *name)

{
  UChar *pUVar1;
  ConstChar16Ptr local_48 [3];
  
  UnicodeString::setToBogus(name);
  if (((0x1f < (ushort)(tzCanonicalID->fUnion).fStackFields.fLengthAndFlags) &&
      (0x1f < (ushort)(mzID->fUnion).fStackFields.fLengthAndFlags)) &&
     (0x1f < (ushort)(mzDisplayName->fUnion).fStackFields.fLengthAndFlags)) {
    umtx_lock_63((UMutex *)gLock);
    pUVar1 = getPartialLocationName(this,tzCanonicalID,mzID,isLong,mzDisplayName);
    umtx_unlock_63((UMutex *)gLock);
    if (pUVar1 == (UChar *)0x0) {
      UnicodeString::setToBogus(name);
    }
    else {
      local_48[0].p_ = pUVar1;
      UnicodeString::setTo(name,'\x01',local_48,-1);
    }
  }
  return name;
}

Assistant:

UnicodeString&
TZGNCore::getPartialLocationName(const UnicodeString& tzCanonicalID,
                        const UnicodeString& mzID, UBool isLong, const UnicodeString& mzDisplayName,
                        UnicodeString& name) const {
    name.setToBogus();
    if (tzCanonicalID.isEmpty() || mzID.isEmpty() || mzDisplayName.isEmpty()) {
        return name;
    }

    const UChar *uplname = NULL;
    TZGNCore *nonConstThis = const_cast<TZGNCore *>(this);
    umtx_lock(&gLock);
    {
        uplname = nonConstThis->getPartialLocationName(tzCanonicalID, mzID, isLong, mzDisplayName);
    }
    umtx_unlock(&gLock);

    if (uplname == NULL) {
        name.setToBogus();
    } else {
        name.setTo(TRUE, uplname, -1);
    }
    return name;
}